

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int Gia_SplitCofVar(Gia_Man_t *p,int LookAhead,int *pnFanouts,int *pnCost)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pObj;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int local_50;
  int local_4c;
  
  if (LookAhead == 1) {
    iVar1 = Gia_SplitCofVar2(p,pnFanouts,pnCost);
    return iVar1;
  }
  __ptr = Gia_PermuteSpecialOrder(p);
  uVar4 = p->vCis->nSize - p->nRegs;
  if (LookAhead < (int)uVar4) {
    uVar4 = LookAhead;
  }
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  local_4c = -1;
  local_50 = 1000000000;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pGVar3 = Gia_ManDupCofactorVar(p,__ptr[uVar6],0);
    iVar1 = Gia_ManAndNum(pGVar3);
    Gia_ManStop(pGVar3);
    pGVar3 = Gia_ManDupCofactorVar(p,__ptr[uVar6],1);
    iVar2 = Gia_ManAndNum(pGVar3);
    Gia_ManStop(pGVar3);
    if (iVar2 + iVar1 < local_50) {
      local_4c = __ptr[uVar6];
      local_50 = iVar2 + iVar1;
    }
  }
  free(__ptr);
  if (-1 < local_4c) {
    pObj = Gia_ManPi(p,local_4c);
    iVar1 = Gia_ObjRefNum(p,pObj);
    *pnFanouts = iVar1;
    *pnCost = local_50;
    return local_4c;
  }
  __assert_fail("iBest >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                ,0x105,"int Gia_SplitCofVar(Gia_Man_t *, int, int *, int *)");
}

Assistant:

int Gia_SplitCofVar( Gia_Man_t * p, int LookAhead, int * pnFanouts, int * pnCost )
{
    Gia_Man_t * pPart;
    int Cost0, Cost1, CostBest = ABC_INFINITY;
    int * pOrder, i, iBest = -1;
    if ( LookAhead == 1 )
        return Gia_SplitCofVar2( p, pnFanouts, pnCost );
    pOrder = Gia_PermuteSpecialOrder( p );
    LookAhead = Abc_MinInt( LookAhead, Gia_ManPiNum(p) );
    for ( i = 0; i < LookAhead; i++ )
    {
        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 0 );
        Cost0 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 1 );
        Cost1 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        if ( CostBest > Cost0 + Cost1 )
            CostBest = Cost0 + Cost1, iBest = pOrder[i];

/*
        pPart = Gia_ManDupExist( p, pOrder[i] );
        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d    %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1, Gia_ManAndNum(p), Gia_ManAndNum(pPart) );
        Gia_ManStop( pPart );

        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1 );
*/
    }
    ABC_FREE( pOrder );
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = CostBest;
    return iBest;
}